

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O1

bool __thiscall CfgNode::addSuccessor(CfgNode *this,CfgNode *succ)

{
  pair<std::_Rb_tree_iterator<CfgNode::Edge>,_bool> pVar1;
  Edge local_10;
  
  if (this->m_type - CFG_EXIT < 2) {
    __assert_fail("this->type() != CfgNode::CFG_EXIT && this->type() != CfgNode::CFG_HALT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgNode.cpp"
                  ,0x48,"bool CfgNode::addSuccessor(CfgNode *)");
  }
  if (succ->m_type != CFG_ENTRY) {
    local_10._vptr_Edge = (_func_int **)&PTR__Edge_001179f8;
    local_10.node = succ;
    pVar1 = std::
            _Rb_tree<CfgNode::Edge,_CfgNode::Edge,_std::_Identity<CfgNode::Edge>,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>
            ::_M_insert_unique<CfgNode::Edge>(&(this->m_succs)._M_t,&local_10);
    return (bool)(pVar1.second & 1);
  }
  __assert_fail("succ->type() != CfgNode::CFG_ENTRY",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgNode.cpp"
                ,0x49,"bool CfgNode::addSuccessor(CfgNode *)");
}

Assistant:

bool CfgNode::addSuccessor(CfgNode* succ) {
	assert(this->type() != CfgNode::CFG_EXIT && this->type() != CfgNode::CFG_HALT);
	assert(succ->type() != CfgNode::CFG_ENTRY);

	return m_succs.insert(CfgNode::Edge(succ)).second;
}